

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O0

int mpickobj(monst *mtmp,obj *otmp)

{
  bool bVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  boolean snuff_otmp;
  int freed_otmp;
  obj *otmp_local;
  monst *mtmp_local;
  
  bVar1 = false;
  if ((*(uint *)&otmp->field_0x4a >> 0x13 & 1) != 0) {
    bVar2 = obj_sheds_light(otmp);
    if (bVar2 != '\0') {
      bVar2 = attacktype(mtmp->data,0xb);
      if (bVar2 != '\0') {
        if ((((u._1052_1_ & 1) != 0) && (mtmp == u.ustuck)) &&
           (((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
          pcVar4 = Tobjnam(otmp,"go");
          pline("%s out.",pcVar4);
        }
        bVar1 = true;
      }
    }
  }
  carry_obj_effects(otmp);
  iVar3 = add_to_minv(mtmp,otmp);
  if (bVar1) {
    snuff_light_source((int)mtmp->mx,(int)mtmp->my);
  }
  return iVar3;
}

Assistant:

int mpickobj(struct monst *mtmp, struct obj *otmp)
{
    int freed_otmp;

    boolean snuff_otmp = FALSE;
    /* don't want hidden light source inside the monster; assumes that
       engulfers won't have external inventories; whirly monsters cause
       the light to be extinguished rather than letting it shine thru */
    if (otmp->lamplit &&  /* hack to avoid function calls for most objs */
      	obj_sheds_light(otmp) &&
	attacktype(mtmp->data, AT_ENGL)) {
	/* this is probably a burning object that you dropped or threw */
	if (u.uswallow && mtmp == u.ustuck && !Blind)
	    pline("%s out.", Tobjnam(otmp, "go"));
	snuff_otmp = TRUE;
    }
    /* Must do carrying effects on object prior to add_to_minv() */
    carry_obj_effects(otmp);
    /* add_to_minv() might free otmp [if merged with something else],
       so we have to call it after doing the object checks */
    freed_otmp = add_to_minv(mtmp, otmp);
    /* and we had to defer this until object is in mtmp's inventory */
    if (snuff_otmp) snuff_light_source(mtmp->mx, mtmp->my);

    return freed_otmp;
}